

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O0

Promise<kj::Maybe<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_> __thiscall
kj::AsyncCapabilityStream::tryReceiveStream(AsyncCapabilityStream *this)

{
  ResultHolder *pRVar1;
  ResultHolder *pRVar2;
  Own<ResultHolder,_std::nullptr_t> *other;
  long *in_RSI;
  Own<ResultHolder,_std::nullptr_t> local_50 [2];
  undefined1 local_30 [8];
  Promise<kj::AsyncCapabilityStream::ReadResult> promise;
  Own<ResultHolder,_std::nullptr_t> result;
  AsyncCapabilityStream *this_local;
  
  heap<kj::AsyncCapabilityStream::tryReceiveStream()::ResultHolder>();
  pRVar1 = Own<ResultHolder,_std::nullptr_t>::operator->
                     ((Own<ResultHolder,_std::nullptr_t> *)&promise);
  pRVar2 = Own<ResultHolder,_std::nullptr_t>::operator->
                     ((Own<ResultHolder,_std::nullptr_t> *)&promise);
  (**(code **)(*in_RSI + 0x88))(local_30,in_RSI,pRVar1,1,1,&pRVar2->stream,1);
  other = mv<kj::Own<kj::AsyncCapabilityStream::tryReceiveStream()::ResultHolder,decltype(nullptr)>>
                    ((Own<ResultHolder,_std::nullptr_t> *)&promise);
  Own<ResultHolder,_std::nullptr_t>::Own(local_50,other);
  Promise<kj::AsyncCapabilityStream::ReadResult>::
  then<kj::AsyncCapabilityStream::tryReceiveStream()::__0>
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)this,(Type *)local_30);
  tryReceiveStream()::$_0::~__0((__0 *)local_50);
  Promise<kj::AsyncCapabilityStream::ReadResult>::~Promise
            ((Promise<kj::AsyncCapabilityStream::ReadResult> *)local_30);
  Own<ResultHolder,_std::nullptr_t>::~Own((Own<ResultHolder,_std::nullptr_t> *)&promise);
  return (PromiseBase)(PromiseBase)this;
}

Assistant:

kj::Promise<Maybe<Own<AsyncCapabilityStream>>> AsyncCapabilityStream::tryReceiveStream() {
  struct ResultHolder {
    byte b;
    Own<AsyncCapabilityStream> stream;
  };
  auto result = kj::heap<ResultHolder>();
  auto promise = tryReadWithStreams(&result->b, 1, 1, &result->stream, 1);
  return promise.then([result = kj::mv(result)](ReadResult actual) mutable
                      -> Maybe<Own<AsyncCapabilityStream>> {
    if (actual.byteCount == 0) {
      return kj::none;
    }

    KJ_REQUIRE(actual.capCount == 1,
        "expected to receive a capability (e.g. file descriptor via SCM_RIGHTS), but didn't") {
      return kj::none;
    }

    return kj::mv(result->stream);
  });
}